

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithAttributes
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyAttributes attributes,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  ScriptContext *pSVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  int iVar7;
  PropertyId propertyId_00;
  undefined4 *puVar8;
  PropertyRecord *pPVar9;
  byte bVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  Var value_00;
  uint32 local_74;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPStack_70;
  uint32 debugIndex;
  int i;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  Var local_50;
  uint local_44;
  ScriptContext *local_40;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  local_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)info;
  local_50 = value;
  if (((flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None) &&
     (BVar5 = ScriptContext::IsNumericPropertyId(local_40,propertyId,&local_74), BVar5 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x724,
                                "(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)))"
                                ,
                                "!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex))"
                               );
    if (!bVar4) goto LAB_00d9cbf8;
    *puVar8 = 0;
    value = local_50;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x726,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00d9cbf8;
    *puVar8 = 0;
    value = local_50;
  }
  uVar11 = (uint)CONCAT71(in_register_00000081,attributes);
  local_60 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_60,&local_38,(int *)&stack0xffffffffffffff90)
  ;
  if (!bVar4) {
    if (local_60->isNumeric == true) {
      uVar6 = PropertyRecord::GetNumericValue(local_60);
      iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2e])
                        (this,instance,(ulong)uVar6,value,attributes);
      return iVar7;
    }
    BVar5 = AddProperty(this,instance,local_60,value,attributes,(PropertyValueInfo *)propertyRecord,
                        flags,SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0),
                        possibleSideEffects);
    return BVar5;
  }
  if (((local_38->flags & (UsedAsFixed|IsFixed)) != None) &&
     (((local_38->Attributes & 8) != 0 ||
      (((local_38->Data == -1 && (local_38->Getter == -1)) && (local_38->Setter == -1)))))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72b,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar4) goto LAB_00d9cbf8;
    *puVar8 = 0;
  }
  value_00 = local_50;
  bVar10 = local_38->Attributes;
  if ((uVar11 & 0x10 & (uint)bVar10) == 0) {
    local_44 = uVar11;
    if (((attributes & 0x10) == 0) && ((bVar10 & 8) != 0)) {
      if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
         (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                            (&this->super_DynamicTypeHandler,local_40,
                             SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0)), !bVar4
         )) {
        return 0;
      }
      ScriptContext::InvalidateProtoCaches(local_40,propertyId);
      local_38->Attributes =
           (char)(local_38->Attributes * '\b') >> 7 & local_38->Attributes & 0xd0 | (byte)local_44;
      DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
      goto LAB_00d9c8cb;
    }
    if ((local_38->flags & IsShadowed) != None) {
      bVar10 = bVar10 & 0xd0;
LAB_00d9cbcb:
      local_38->Attributes = bVar10 | (byte)local_44;
      goto LAB_00d9c7c7;
    }
    if ((uVar11 & 0x10) == (bVar10 & 0x10)) {
      bVar10 = bVar10 & 0x10;
      if (((attributes & 0x10) == 0) && ((local_38->flags & IsAccessor) != None)) {
        _i = JavascriptOperators::GetProperty
                       (&instance->super_RecyclableObject,0x67,local_40,(PropertyValueInfo *)0x0);
        if (((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
             TypeIds_GlobalObject) &&
           (bVar4 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar4)
           ) {
          BVar5 = JavascriptOperators::IsClassConstructor(instance);
          if ((BVar5 == 0) && (BVar5 = JavascriptOperators::IsClassConstructor(_i), BVar5 == 0)) {
            BVar5 = JavascriptOperators::IsClassMethod(_i);
            if (((~(uVar11 & 0xff) & 6) != 0) || (BVar5 == 0)) {
LAB_00d9ca2a:
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar8 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x78a,
                                          "(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) || ((JavascriptOperators::IsClassConstructor(instance) || JavascriptOperators::IsClassConstructor(ctor) || JavascriptOperators::IsClassMethod(ctor)) && (attributes & (0x02|0x04)) == (0x02|0x04)))"
                                          ,
                                          "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property"
                                         );
              if (!bVar4) {
LAB_00d9cbf8:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar8 = 0;
            }
          }
          else if ((~(uVar11 & 0xff) & 6) != 0) goto LAB_00d9ca2a;
        }
        if ((local_38->Attributes & 2) == 0) {
          if (local_40 == (ScriptContext *)0x0) {
            return 0;
          }
          bVar4 = ThreadContext::RecordImplicitException(local_40->threadContext);
          pSVar3 = local_40;
          if (!bVar4) {
            return 0;
          }
          pPVar9 = ThreadContext::GetPropertyName(local_40->threadContext,propertyId);
          JavascriptError::ThrowTypeError(pSVar3,-0x7ff5ec2a,(PCWSTR)(pPVar9 + 1));
        }
        DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
        DynamicObject::ChangeType(instance);
        bVar10 = local_38->Attributes & 0x10;
      }
      goto LAB_00d9cbcb;
    }
    iVar7 = (this->super_DynamicTypeHandler).slotCapacity;
    if (iVar7 <= this->nextPropertyIndex) {
      if (0x3ffffffe < iVar7) {
        Throw::OutOfMemory();
      }
      EnsureSlotCapacity(this,instance,1);
    }
    bVar4 = (attributes & 0x10) != 0;
    bVar10 = local_38->Attributes & 0xc0 | (byte)local_44;
    if (bVar4) {
      bVar10 = (byte)local_44 & 0xc0 | local_38->Attributes;
    }
    local_38->Attributes = bVar10;
    DictionaryPropertyDescriptor<int>::AddShadowedData(local_38,&this->nextPropertyIndex,bVar4);
    if ((this->super_DynamicTypeHandler).slotCapacity < this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x765,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar4) goto LAB_00d9cbf8;
      *puVar8 = 0;
    }
    value_00 = local_50;
    if ((attributes & 0x10) == 0) goto LAB_00d9c8cb;
    DynamicObject::ChangeType(instance);
  }
  else {
LAB_00d9c7c7:
    value_00 = local_50;
    if ((attributes & 0x10) == 0) {
LAB_00d9c8cb:
      SetPropertyWithDescriptor<false>
                (this,instance,local_60,&local_38,value_00,flags,(PropertyValueInfo *)propertyRecord
                );
      goto LAB_00d9c8ed;
    }
  }
  SetPropertyWithDescriptor<true>
            (this,instance,local_60,&local_38,value_00,flags,(PropertyValueInfo *)propertyRecord);
LAB_00d9c8ed:
  if (local_38 != (DictionaryPropertyDescriptor<int> *)0x0) {
    if ((local_38->Attributes & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffff90);
    pPStack_70 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffff90);
    this_00 = pPStack_70;
    value_00 = local_50;
    if (((local_38->Attributes & 4) == 0) &&
       (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
       pSVar3 = local_40, value_00 = local_50, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)
       ) {
      propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_40,propertyId);
      ScriptContext::InvalidateStoreFieldCaches(pSVar3,propertyId_00);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
      value_00 = local_50;
    }
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,value_00,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

#ifdef DEBUG
        uint32 debugIndex;
        Assert(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)));
#endif
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (attributes & descriptor->Attributes & PropertyLetConstGlobal)
            {
                // Do not need to change the descriptor or its attributes if setting the initial value of a LetConstGlobal
            }
            else if (descriptor->Attributes & PropertyDeleted && !(attributes & PropertyLetConstGlobal))
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }

                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = attributes;
                }
                descriptor->ConvertToData();
            }
            else if (descriptor->GetIsShadowed())
            {
                descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
            }
            else if ((descriptor->Attributes & PropertyLetConstGlobal) != (attributes & PropertyLetConstGlobal))
            {
                // We could potentially need 1 new slot by AddShadowedData(), try pre-reserve
                if (this->GetSlotCapacity() <= nextPropertyIndex)
                {
                    if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
                    {
                        return ConvertToBigDictionaryTypeHandler(instance)->SetPropertyWithAttributes(
                            instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }

                    this->EnsureSlotCapacity(instance);
                }

                bool addingLetConstGlobal = (attributes & PropertyLetConstGlobal) != 0;

                if (addingLetConstGlobal)
                {
                    descriptor->Attributes = descriptor->Attributes | (attributes & PropertyNoRedecl);
                }
                else
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & PropertyNoRedecl);
                }

                descriptor->AddShadowedData(nextPropertyIndex, addingLetConstGlobal);

                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved above

                if (addingLetConstGlobal)
                {
                    // If shadowing a global property with a let/const, need to invalidate
                    // JIT fast path cache since look up could now go to the let/const instead
                    // of the global property.
                    //
                    // Do not need to invalidate when adding a global property that gets shadowed
                    // by an existing let/const, since all caches will still be correct.
                    instance->ChangeType();
                }
            }
            else
            {
                if (descriptor->GetIsAccessor() && !(attributes & PropertyLetConstGlobal))
                {
#if DEBUG
                    Var ctor = JavascriptOperators::GetProperty(instance, PropertyIds::constructor, scriptContext);
#endif
                    AssertMsg(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) ||
                        // ValidateAndApplyPropertyDescriptor says to preserve Configurable and Enumerable flags

                        // For InitRootFld, which is equivalent to
                        // CreateGlobalFunctionBinding called from GlobalDeclarationInstantiation in the spec,
                        // we can assume that the attributes specified include enumerable and writable.  Thus
                        // we don't need to preserve the original values of these two attributes and therefore
                        // do not need to change InitRootFld from being a SetPropertyWithAttributes API call to
                        // something else.  All we need to do is convert the descriptor to a data descriptor.
                        // Built-in Function.prototype properties 'length', 'arguments', and 'caller' are special cases.

                        ((JavascriptOperators::IsClassConstructor(instance) // Static method
                            || JavascriptOperators::IsClassConstructor(ctor)
                            || JavascriptOperators::IsClassMethod(ctor))
                            && (attributes & PropertyClassMemberDefaults) == PropertyClassMemberDefaults),
                        // 14.3.9: InitClassMember sets property descriptor to {writable:true, enumerable:false, configurable:true}

                        "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property");
                    if (!(descriptor->Attributes & PropertyConfigurable))
                    {
                        if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable, scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
                        }
                        return FALSE;
                    }
                    descriptor->ConvertToData();
                    instance->ChangeType();
                }

                // Make sure to keep the PropertyLetConstGlobal bit as is while taking the new attributes.
                descriptor->Attributes = attributes | (descriptor->Attributes & PropertyLetConstGlobal);
            }

            if (attributes & PropertyLetConstGlobal)
            {
                SetPropertyWithDescriptor<true>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            else
            {
                SetPropertyWithDescriptor<false>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            if (descriptor != nullptr)  //descriptor can dissappear, so this reference may not exist.
            {
                if (descriptor->Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, throwIfNotExtensible, possibleSideEffects);
    }